

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

void wabt::WriteDoubleHex(char *buffer,size_t size,uint64_t bits)

{
  undefined4 *puVar1;
  byte *pbVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  size_t __n;
  char buffer_1 [40];
  undefined1 local_38 [40];
  
  puVar1 = (undefined4 *)local_38;
  uVar9 = (uint)(bits >> 0x34) & 0x7ff;
  uVar4 = uVar9 - 0x3ff;
  if ((long)bits < 0) {
    puVar1 = (undefined4 *)(local_38 + 1);
    local_38[0] = 0x2d;
  }
  uVar6 = bits & 0xfffffffffffff;
  if (uVar4 == 0x400) {
    pbVar2 = (byte *)((long)puVar1 + 3);
    if (uVar6 == 0) {
      *puVar1 = 0x666e69;
    }
    else {
      *puVar1 = 0x6e616e;
      if (uVar6 != 0x8000000000000) {
        pbVar2[0] = 0x3a;
        pbVar2[1] = 0x30;
        pbVar2[2] = 0x78;
        pbVar2[3] = 0;
        iVar8 = -0x10;
        do {
          uVar7 = uVar6 << 4;
          uVar5 = uVar6 >> 0x38;
          iVar8 = iVar8 + 1;
          uVar6 = uVar7;
        } while (uVar5 == 0);
        pbVar2 = (byte *)((long)puVar1 + 6);
        for (; iVar8 != 0; iVar8 = iVar8 + 1) {
          *pbVar2 = "0123456789abcdef"[uVar7 >> 0x3c];
          pbVar2 = pbVar2 + 1;
          uVar7 = uVar7 << 4;
        }
      }
    }
    goto LAB_00224e1b;
  }
  *(undefined2 *)puVar1 = 0x7830;
  *(byte *)((long)puVar1 + 2) = (uVar9 == 0 && uVar6 == 0) ^ 0x31;
  if (uVar6 == 0) {
    pcVar3 = (char *)((long)puVar1 + 3);
  }
  else {
    uVar7 = uVar6 << 0xc;
    if (uVar9 == 0) {
      uVar5 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x3f;
      uVar7 = uVar7 << ((char)uVar5 + 1U & 0x3f);
      uVar4 = -(int)uVar5 - 0x3ff;
      if (uVar5 == 0x3f) {
        *(undefined1 *)((long)puVar1 + 3) = 0x2e;
        pcVar3 = (char *)(puVar1 + 1);
        goto LAB_00224d50;
      }
    }
    *(undefined1 *)((long)puVar1 + 3) = 0x2e;
    pcVar3 = (char *)(puVar1 + 1);
    for (; uVar7 != 0; uVar7 = uVar7 << 4) {
      *pcVar3 = "0123456789abcdef"[uVar7 >> 0x3c];
      pcVar3 = pcVar3 + 1;
    }
  }
LAB_00224d50:
  *pcVar3 = 'p';
  if (uVar9 == 0 && uVar6 == 0) {
    pcVar3[3] = '\0';
    pcVar3[1] = '+';
    pcVar3[2] = '0';
    pbVar2 = (byte *)(pcVar3 + 3);
    goto LAB_00224e1b;
  }
  uVar9 = -uVar4;
  if (0 < (int)uVar4) {
    uVar9 = uVar4;
  }
  pcVar3[1] = (char)((int)uVar4 >> 0x1f) * -2 + '+';
  if (uVar9 < 1000) {
    pbVar2 = (byte *)(pcVar3 + 2);
    if (99 < uVar9) goto LAB_00224da6;
    if (9 < uVar9) goto LAB_00224dd0;
  }
  else {
    pcVar3[2] = '1';
    pbVar2 = (byte *)(pcVar3 + 3);
LAB_00224da6:
    *pbVar2 = (char)(uVar9 / 100) + (char)(((ulong)uVar9 / 100) * 0x1999999a >> 0x20) * -10 | 0x30;
    pbVar2 = pbVar2 + 1;
LAB_00224dd0:
    *pbVar2 = (char)(uVar9 / 10) + (char)(((ulong)uVar9 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    pbVar2 = pbVar2 + 1;
  }
  *pbVar2 = (char)uVar9 + (char)(uVar9 / 10) * -10 | 0x30;
  pbVar2 = pbVar2 + 1;
LAB_00224e1b:
  __n = size - 1;
  if ((ulong)((long)pbVar2 - (long)local_38) < size) {
    __n = (long)pbVar2 - (long)local_38;
  }
  memcpy(buffer,local_38,__n);
  buffer[__n] = '\0';
  return;
}

Assistant:

void WriteDoubleHex(char* buffer, size_t size, uint64_t bits) {
  return FloatWriter<double>::WriteHex(buffer, size, bits);
}